

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::anon_unknown_15::LCSSARewriter::UseRewriter::CreatePhiInstruction
          (UseRewriter *this,BasicBlock *bb,Instruction *value)

{
  CFG *this_00;
  IRContext *context;
  uint32_t uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  size_type sVar2;
  const_reference __x;
  Instruction *pIVar3;
  Instruction *local_80;
  Instruction *incoming_phi;
  undefined1 local_70 [8];
  InstructionBuilder builder;
  ulong local_48;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *bb_preds;
  vector<unsigned_int,_std::allocator<unsigned_int>_> incomings;
  Instruction *value_local;
  BasicBlock *bb_local;
  UseRewriter *this_local;
  
  incomings.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)value;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bb_preds);
  this_00 = this->base_->cfg_;
  uVar1 = BasicBlock::id(bb);
  this_01 = CFG::preds(this_00,uVar1);
  local_48 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_01);
    if (sVar2 <= local_48) break;
    builder._28_4_ =
         Instruction::result_id
                   ((Instruction *)
                    incomings.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bb_preds,
               (value_type_conflict2 *)&builder.field_0x1c);
    __x = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,local_48);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bb_preds,__x);
    local_48 = local_48 + 1;
  }
  context = this->base_->context_;
  BasicBlock::begin((BasicBlock *)&incoming_phi);
  pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*
                     ((iterator_template<spvtools::opt::Instruction> *)&incoming_phi);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)local_70,context,pIVar3,kAnalysisInstrToBlockMapping);
  uVar1 = Instruction::type_id(this->def_insn_);
  local_80 = InstructionBuilder::AddPhi
                       ((InstructionBuilder *)local_70,uVar1,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bb_preds,0);
  std::
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  ::insert(&this->rewritten_,&local_80);
  pIVar3 = local_80;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bb_preds);
  return pIVar3;
}

Assistant:

inline Instruction* CreatePhiInstruction(BasicBlock* bb,
                                             const Instruction& value) {
      std::vector<uint32_t> incomings;
      const std::vector<uint32_t>& bb_preds = base_->cfg_->preds(bb->id());
      for (size_t i = 0; i < bb_preds.size(); i++) {
        incomings.push_back(value.result_id());
        incomings.push_back(bb_preds[i]);
      }
      InstructionBuilder builder(base_->context_, &*bb->begin(),
                                 IRContext::kAnalysisInstrToBlockMapping);
      Instruction* incoming_phi =
          builder.AddPhi(def_insn_.type_id(), incomings);

      rewritten_.insert(incoming_phi);
      return incoming_phi;
    }